

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O2

type_conflict jsteemann::atoi<long>(char *p,char *e,int *errcode)

{
  byte bVar1;
  long lVar2;
  type_conflict tVar3;
  int iVar4;
  
  if (p == e) {
    *errcode = -1;
    return 0;
  }
  if (*p == '-') {
    lVar2 = atoi_negative<long>(p + 1,e,errcode);
    return lVar2;
  }
  if (*p == '+') {
    lVar2 = atoi_positive<long>(p + 1,e,errcode);
    return lVar2;
  }
  iVar4 = -1;
  if (p == e) {
    tVar3 = 0;
    iVar4 = -1;
  }
  else {
    tVar3 = 0;
    do {
      bVar1 = *p;
      if (((ulong)bVar1 < 0x21) && ((0x100003e01U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
      if ((byte)(bVar1 - 0x3a) < 0xf6) goto LAB_002cdee4;
      if ((0xccccccccccccccc < tVar3) || (tVar3 == 0xccccccccccccccc && 7 < (byte)(bVar1 - 0x30))) {
        iVar4 = -3;
        goto LAB_002cdee4;
      }
      tVar3 = (ulong)(byte)(bVar1 - 0x30) + tVar3 * 10;
      p = (char *)((byte *)p + 1);
    } while (p < e);
    iVar4 = 0;
  }
LAB_002cdee4:
  *errcode = iVar4;
  return tVar3;
}

Assistant:

inline typename std::enable_if<std::is_signed<T>::value, T>::type atoi(char const* p, char const* e, int& errcode) JSTEEMANN_NOEXCEPT {
  if (ATOI_UNLIKELY(p == e)) {
    errcode = -1;
    return T();
  }

  if (*p == '-') {
    return atoi_negative<T>(++p, e, errcode);
  }
  if (ATOI_UNLIKELY(*p == '+')) {
    ++p;
  }

  return atoi_positive<T>(p, e, errcode);
}